

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

void nh_ws_parse(ws_context_t *ctx)

{
  uint32_t *puVar1;
  byte bVar2;
  uchar uVar3;
  nh_ws_parse_state nVar4;
  uchar *puVar5;
  byte *pbVar6;
  uint64_t uVar7;
  long lVar8;
  uint64_t uVar9;
  char *pcVar10;
  char *__dest;
  uint32_t uVar11;
  size_t __n;
  uint uVar12;
  
  uVar12 = (ctx->stream).length;
  if (uVar12 < 6) {
    return;
  }
  nVar4 = ctx->parse_state;
  if (nVar4 == PARSE_WS_HEAD) {
    pbVar6 = (byte *)(ctx->stream).buf;
    (ctx->frame).fin = *pbVar6 >> 7;
    (ctx->frame).opcode = *pbVar6 & 0xf;
    (ctx->stream).index = 1;
    (ctx->frame).mask = pbVar6[1] >> 7;
    bVar2 = pbVar6[1];
    uVar7 = (uint64_t)(bVar2 & 0x7f);
    (ctx->frame).payload_length = uVar7;
    (ctx->stream).index = 2;
    if (uVar7 == 0x7f) {
      (ctx->frame).payload_length = *(uint64_t *)(pbVar6 + 2);
      puVar5 = (uchar *)((long)&(ctx->frame).payload_length + 7);
      lVar8 = 0x20;
      do {
        uVar3 = (ctx->frame).masking_key[lVar8 + -0x28];
        (ctx->frame).masking_key[lVar8 + -0x28] = *puVar5;
        *puVar5 = uVar3;
        lVar8 = lVar8 + 1;
        puVar5 = puVar5 + -1;
      } while (lVar8 != 0x24);
      uVar12 = (ctx->stream).index + 8;
      (ctx->stream).index = uVar12;
      pbVar6 = (byte *)(ctx->stream).buf;
      uVar7 = (ctx->frame).payload_length;
    }
    else {
      uVar12 = 2;
      if ((bVar2 & 0x7f) == 0x7e) {
        uVar7 = (uint64_t)(ushort)(*(ushort *)(pbVar6 + 2) << 8 | *(ushort *)(pbVar6 + 2) >> 8);
        (ctx->frame).payload_length = uVar7;
        (ctx->stream).index = 4;
        uVar12 = 4;
      }
    }
    *(undefined4 *)(ctx->frame).masking_key = *(undefined4 *)(pbVar6 + uVar12);
    uVar11 = uVar12 + 4;
    (ctx->stream).index = uVar11;
    if (uVar7 == 0) {
      ctx->parse_state = PARSE_WS_DONE;
      return;
    }
    pcVar10 = (char *)malloc(uVar7 + 1);
    (ctx->frame).payload = pcVar10;
    pcVar10[uVar7] = '\0';
    ctx->parse_state = PARSE_WS_PAYLOAD;
    uVar12 = (ctx->stream).length;
  }
  else {
    if (nVar4 != PARSE_WS_PAYLOAD) {
      if (nVar4 != PARSE_WS_DONE) {
        return;
      }
      uVar7 = (ctx->frame).payload_length;
      goto LAB_00106f25;
    }
    uVar7 = (ctx->frame).payload_length;
    uVar11 = (ctx->stream).index;
  }
  uVar9 = (ctx->frame).payload_consumed_length;
  __n = uVar7 - uVar9;
  uVar12 = uVar12 - uVar11;
  __dest = (ctx->frame).payload + uVar9;
  pcVar10 = (ctx->stream).buf + uVar11;
  if (uVar12 < __n) {
    memcpy(__dest,pcVar10,(ulong)uVar12);
    (ctx->frame).payload_consumed_length = (ctx->frame).payload_length;
    puVar1 = &(ctx->stream).index;
    *puVar1 = *puVar1 + uVar12;
    return;
  }
  memcpy(__dest,pcVar10,__n);
  uVar7 = (ctx->frame).payload_length;
  (ctx->frame).payload_consumed_length = uVar7;
  puVar1 = &(ctx->stream).index;
  *puVar1 = *puVar1 + (int)__n;
  ctx->parse_state = PARSE_WS_DONE;
LAB_00106f25:
  if (uVar7 != 0) {
    pcVar10 = (ctx->frame).payload;
    uVar9 = 0;
    do {
      pbVar6 = (byte *)(pcVar10 + uVar9);
      *pbVar6 = *pbVar6 ^ (ctx->frame).masking_key[(uint)uVar9 & 3];
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
  }
  pcVar10 = (ctx->stream).buf;
  if (pcVar10 != (char *)0x0) {
    free(pcVar10);
    (ctx->stream).buf = (char *)0x0;
    (ctx->stream).length = 0;
    (ctx->stream).index = 0;
  }
  return;
}

Assistant:

void nh_ws_parse(ws_context_t *ctx) {
    /**
      0                   1                   2                   3
      0 1 2 3 4 5 6 7 8 9 0 1 2 3 4 5 6 7 8 9 0 1 2 3 4 5 6 7 8 9 0 1
     +-+-+-+-+-------+-+-------------+-------------------------------+
     |F|R|R|R| opcode|M| Payload     |    Extended payload length    |
     |I|S|S|S|  (4)  |A|     (7)     |             (16/64)           |
     |N|V|V|V|       |S|             |   (if payload len==126/127)   |
     | |1|2|3|       |K|             |                               |
     +-+-+-+-+-------+-+-------------+ - - - - - - - - - - - - - - - +
     |     Extended payload length continued, if payload len == 127  |
     + - - - - - - - - - - - - - - - +-------------------------------+
     |                               |Masking-key, if MASK set to 1  |
     +-------------------------------+-------------------------------+
     | Masking-key (continued)       |          Payload Data         |
     +-------------------------------- - - - - - - - - - - - - - - - +
     :                     Payload Data continued ...                :
     + - - - - - - - - - - - - - - - - - - - - - - - - - - - - - - - +
     |                     Payload Data continued ...                |
     +---------------------------------------------------------------+
     **/

    nh_stream_t *stream = &ctx->stream;
    // return if not complete
    if (stream->length < 6) return;

    nh_ws_frame *frame = &ctx->frame;
    uint64_t need_len, remain_len;
    switch (ctx->parse_state) {
        case PARSE_WS_HEAD:
            frame->fin = (stream->buf[0] & 0x80) == 0x80;
            // skip parse RSV1~3
            frame->opcode = stream->buf[0] & 0x0F;
            stream->index = 1;
            frame->mask = (stream->buf[1] & 0x80) == 0X80;
            frame->payload_length = stream->buf[1] & 0x7F;
            stream->index = 2;
            if (frame->payload_length == 126) {
                frame->payload_length = (stream->buf[stream->index] & 0xFF) << 8 |
                                        (stream->buf[stream->index + 1] & 0xFF);
                stream->index += 2;
            } else if (frame->payload_length == 127) {
                memcpy(&(frame->payload_length), &stream->buf[stream->index], 8);
                nh_reverse_endian((char *) &frame->payload_length, 8);
                stream->index += 8;
            }
            memcpy(&(frame->masking_key), &stream->buf[stream->index], 4);
            stream->index += 4;

            if (!frame->payload_length) {
                ctx->parse_state = PARSE_WS_DONE;
                return;
            }
            // prepare payload
            frame->payload = malloc(sizeof(char) * frame->payload_length + 1);
            frame->payload[frame->payload_length] = '\0';
            ctx->parse_state = PARSE_WS_PAYLOAD;
            // fallthrough
        case PARSE_WS_PAYLOAD:
            need_len = frame->payload_length - frame->payload_consumed_length;
            remain_len = stream->length - stream->index;
            if (remain_len < need_len) {
                memcpy(&frame->payload[frame->payload_consumed_length],
                       &stream->buf[stream->index],
                       remain_len);
                frame->payload_consumed_length = frame->payload_length;
                stream->index += remain_len;
                return;
            }
            memcpy(&frame->payload[frame->payload_consumed_length],
                   &stream->buf[stream->index],
                   need_len);
            frame->payload_consumed_length = frame->payload_length;
            stream->index += need_len;
            ctx->parse_state = PARSE_WS_DONE;
            // fallthrough
        case PARSE_WS_DONE:
            nh_umask((unsigned char *) frame->payload, frame->payload_length, frame->masking_key);
            nh_stream_free(&ctx->stream);
            break;
    }
}